

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

QRect __thiscall
QTreeViewPrivate::visualRect(QTreeViewPrivate *this,QModelIndex *index,RectRule rule)

{
  char cVar1;
  uint item;
  uint uVar2;
  int iVar3;
  int iVar4;
  LayoutDirection LVar5;
  uint uVar6;
  ulong uVar7;
  QWidget *pQVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  QRect QVar13;
  
  uVar11 = 0xffffffff00000000;
  uVar9 = 0xffffffff;
  if (((-1 < index->r) && (-1 < index->c)) &&
     ((index->m).ptr == (this->super_QAbstractItemViewPrivate).model)) {
    pQVar8 = *(QWidget **)
              &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    cVar1 = (**(code **)(*(long *)pQVar8 + 0x2c0))(pQVar8,index);
    if ((rule == FullRow) || (cVar1 == '\0')) {
      if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate)
        ;
        (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      item = viewIndex(this,index);
      if (-1 < (int)item) {
        uVar9 = (ulong)item;
        iVar10 = index->c;
        if (((this->viewItems).d.ptr[uVar9].field_0x1c & 2) == 0) {
          uVar2 = QHeaderView::sectionViewportPosition
                            (*(QHeaderView **)(*(long *)&pQVar8->field_0x8 + 0x590),iVar10);
          iVar3 = QHeaderView::sectionSize
                            (*(QHeaderView **)(*(long *)&pQVar8->field_0x8 + 0x590),iVar10);
        }
        else {
          iVar3 = QHeaderView::length(this->header);
          uVar2 = 0;
        }
        iVar4 = this->treePosition;
        if (iVar4 < 0) {
          iVar4 = QHeaderView::logicalIndex(this->header,0);
        }
        if (iVar4 == iVar10) {
          if (rule == FullRow) {
LAB_0059ec82:
            pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)pQVar8);
            iVar3 = ((pQVar8->data->crect).x2.m_i - (pQVar8->data->crect).x1.m_i) + 1;
            uVar2 = 0;
          }
          else if (rule == SingleSection || 0 < iVar10) {
            iVar10 = 0;
            if (uVar9 < (ulong)(this->viewItems).d.size) {
              iVar10 = ((uint)this->rootDecoration +
                       (uint)*(ushort *)&(this->viewItems).d.ptr[uVar9].field_0x20) * this->indent;
            }
            iVar3 = iVar3 - iVar10;
            LVar5 = QWidget::layoutDirection(pQVar8);
            iVar4 = 0;
            if (LVar5 != RightToLeft) {
              iVar4 = iVar10;
            }
            uVar2 = iVar4 + uVar2;
          }
        }
        else if (rule == FullRow) goto LAB_0059ec82;
        uVar6 = coordinateForItem(this,item);
        iVar10 = itemHeight(this,item);
        uVar9 = (ulong)((uVar2 + iVar3) - 1);
        uVar12 = (ulong)uVar6 << 0x20;
        uVar7 = (ulong)uVar2;
        uVar11 = (ulong)((uVar6 + iVar10) - 1) << 0x20;
        goto LAB_0059ebc3;
      }
    }
  }
  uVar12 = 0;
  uVar7 = 0;
LAB_0059ebc3:
  QVar13.x2.m_i = (int)(uVar11 | uVar9);
  QVar13.y2.m_i = (int)((uVar11 | uVar9) >> 0x20);
  QVar13.x1.m_i = (int)(uVar12 | uVar7);
  QVar13.y1.m_i = (int)((uVar12 | uVar7) >> 0x20);
  return QVar13;
}

Assistant:

QRect QTreeViewPrivate::visualRect(const QModelIndex &index, RectRule rule) const
{
    Q_Q(const QTreeView);

    if (!isIndexValid(index))
        return QRect();

    // Calculate the entire row's rectangle, even if one of the elements is hidden
    if (q->isIndexHidden(index) && rule != FullRow)
        return QRect();

    executePostedLayout();

    const int viewIndex = this->viewIndex(index);
    if (viewIndex < 0)
        return QRect();

    const bool spanning = viewItems.at(viewIndex).spanning;
    const int column = index.column();

    // if we have a spanning item, make the selection stretch from left to right
    int x = (spanning ? 0 : q->columnViewportPosition(column));
    int width = (spanning ? header->length() : q->columnWidth(column));

    const bool addIndentation = isTreePosition(column) && (column > 0 || rule == SingleSection);

    if (rule == FullRow) {
        x = 0;
        width = q->viewport()->width();
    } else if (addIndentation) {
        // calculate indentation
        const int indentation = indentationForItem(viewIndex);
        width -= indentation;
        if (!q->isRightToLeft())
            x += indentation;
    }

    const int y = coordinateForItem(viewIndex);
    const int height = itemHeight(viewIndex);

    return QRect(x, y, width, height);
}